

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O3

unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
__thiscall
duckdb::DistinctStatistics::Deserialize(DistinctStatistics *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  idx_t total_count;
  _func_int **pp_Var3;
  _Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_> this_00;
  HyperLogLog *pHVar4;
  _Head_base<0UL,_duckdb::HyperLogLog_*,_false> local_40;
  HyperLogLog *local_38;
  idx_t sample_count;
  undefined4 extraout_var_00;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"sample_count");
  pp_Var3 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    sample_count = 0;
  }
  else {
    iVar2 = (*pp_Var3[0x15])(deserializer);
    sample_count = CONCAT44(extraout_var,iVar2);
    pp_Var3 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var3[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"total_count");
  pp_Var3 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    total_count = 0;
  }
  else {
    iVar2 = (*pp_Var3[0x15])(deserializer);
    total_count = CONCAT44(extraout_var_00,iVar2);
    pp_Var3 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var3[5])(deserializer,(ulong)(uVar1 & 0xff));
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"log");
  if ((char)iVar2 == '\0') {
    pHVar4 = (HyperLogLog *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      pHVar4 = (HyperLogLog *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      HyperLogLog::Deserialize((HyperLogLog *)&local_38,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pHVar4 = local_38;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::HyperLogLog_*,_false>)operator_new(0x18);
  local_40._M_head_impl = pHVar4;
  DistinctStatistics((DistinctStatistics *)
                     this_00.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl,
                     (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
                      *)&local_40,sample_count,total_count);
  (this->log).super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
  super__Head_base<0UL,_duckdb::HyperLogLog_*,_false> =
       this_00.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl;
  if (local_40._M_head_impl != (HyperLogLog *)0x0) {
    operator_delete(local_40._M_head_impl);
  }
  return (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         this;
}

Assistant:

unique_ptr<DistinctStatistics> DistinctStatistics::Deserialize(Deserializer &deserializer) {
	auto sample_count = deserializer.ReadPropertyWithDefault<idx_t>(100, "sample_count");
	auto total_count = deserializer.ReadPropertyWithDefault<idx_t>(101, "total_count");
	auto log = deserializer.ReadPropertyWithDefault<unique_ptr<HyperLogLog>>(102, "log");
	auto result = duckdb::unique_ptr<DistinctStatistics>(new DistinctStatistics(std::move(log), sample_count, total_count));
	return result;
}